

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86_avx512::forward_int8
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  int *piVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Option OVar10;
  undefined1 auVar11 [36];
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  undefined8 *puVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int unaff_EBP;
  undefined8 *puVar23;
  uint uVar24;
  undefined8 *puVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  undefined8 *puVar33;
  bool bVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  Mat m;
  Mat m_1;
  ulong local_190;
  Mat local_178;
  ulong local_130;
  ulong local_128;
  int local_11c;
  long local_118;
  ulong local_110;
  undefined1 local_108 [24];
  int iStack_f0;
  Allocator *pAStack_e8;
  int iStack_e0;
  int iStack_dc;
  int iStack_d8;
  undefined8 uStack_d4;
  undefined1 auStack_ec [36];
  size_t local_c8;
  Option *local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  uint local_9c;
  ulong local_98;
  size_t local_90;
  void *local_88;
  ulong local_80;
  undefined1 local_78 [64];
  
  iVar13 = bottom_blob->elempack;
  if (iVar13 == 8) {
    iVar1 = bottom_blob->w;
    local_b0 = (ulong)(uint)bottom_blob->h;
    local_11c = bottom_blob->d;
    uVar12 = bottom_blob->c;
    uVar31 = (ulong)uVar12;
    iVar21 = bottom_blob->dims;
    local_110 = bottom_blob->elemsize;
    if (iVar21 == 1) {
      uVar14 = (this->super_Padding).left;
      uVar24 = uVar14 + iVar1 * 8 + (this->super_Padding).right;
      bVar34 = ((uVar14 | uVar24) & 7) == 0;
      bVar5 = (this->super_Padding).type == 0;
      if (bVar34 && bVar5) {
        Mat::create(top_blob,(int)uVar24 >> 3,local_110 & 0xfffffffffffffff8,8,opt->blob_allocator);
        unaff_EBP = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar15 = (ulong)(this->super_Padding).value;
          iVar26 = (this->super_Padding).left;
          iVar19 = (this->super_Padding).right;
          iVar32 = iVar26 + 7;
          if (-1 < iVar26) {
            iVar32 = iVar26;
          }
          iVar26 = iVar19 + 7;
          if (-1 < iVar19) {
            iVar26 = iVar19;
          }
          unaff_EBP = 0;
          padding_constant_pack8_int8_sse
                    (bottom_blob,top_blob,0,0,iVar32 >> 3,iVar26 >> 3,
                     uVar15 << 0x38 | uVar15 << 0x30 | uVar15 << 0x28 |
                     uVar15 << 0x20 | uVar15 << 0x18 | uVar15 << 0x10 | uVar15 << 8 | uVar15);
        }
      }
      if (bVar34 && bVar5) {
        return unaff_EBP;
      }
    }
    if (iVar21 == 2) {
      uVar14 = (this->super_Padding).top;
      uVar24 = uVar14 + (int)local_b0 * 8 + (this->super_Padding).bottom;
      bVar34 = ((uVar14 | uVar24) & 7) == 0;
      bVar5 = (this->super_Padding).type == 0;
      if (bVar34 && bVar5) {
        Mat::create(top_blob,(this->super_Padding).left + iVar1 + (this->super_Padding).right,
                    (int)uVar24 >> 3,local_110 & 0xfffffffffffffff8,8,opt->blob_allocator);
        unaff_EBP = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar15 = (ulong)(this->super_Padding).value;
          iVar26 = (this->super_Padding).top;
          iVar19 = (this->super_Padding).bottom;
          iVar32 = iVar26 + 7;
          if (-1 < iVar26) {
            iVar32 = iVar26;
          }
          iVar26 = iVar19 + 7;
          if (-1 < iVar19) {
            iVar26 = iVar19;
          }
          padding_constant_pack8_int8_sse
                    (bottom_blob,top_blob,iVar32 >> 3,iVar26 >> 3,(this->super_Padding).left,
                     (this->super_Padding).right,
                     uVar15 << 0x38 | uVar15 << 0x30 | uVar15 << 0x28 |
                     uVar15 << 0x20 | uVar15 << 0x18 | uVar15 << 0x10 | uVar15 << 8 | uVar15);
          unaff_EBP = 0;
        }
      }
      if (bVar34 && bVar5) {
        return unaff_EBP;
      }
    }
    if (iVar21 == 3) {
      uVar14 = (this->super_Padding).front;
      uVar24 = uVar14 + uVar12 * 8 + (this->super_Padding).behind;
      bVar34 = (uVar24 & 7) == 0;
      iVar26 = 1;
      if (bVar34) {
        iVar26 = 8;
      }
      bVar5 = true;
      if (bVar34 && (uVar14 & 7) == 0) {
        if ((uVar24 == uVar12 * 8) || ((this->super_Padding).type == 0)) {
          iVar19 = (int)((long)(int)uVar24 / (long)iVar26);
          Mat::create(top_blob,(this->super_Padding).left + iVar1 + (this->super_Padding).right,
                      (this->super_Padding).top + (int)local_b0 + (this->super_Padding).bottom,
                      iVar19,(local_110 >> 3) << bVar34 * '\x03',iVar26,opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
LAB_0043b97c:
            bVar5 = false;
          }
          else {
            bVar5 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar32 = (this->super_Padding).front;
              iVar17 = iVar32 + 7;
              if (-1 < iVar32) {
                iVar17 = iVar32;
              }
              if (0 < iVar19) {
                local_9c = -(iVar17 >> 3);
                local_80 = (long)(int)uVar24 / (long)iVar26 & 0xffffffff;
                uVar15 = 0;
                auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                local_c0 = opt;
                local_b8 = uVar31;
                uVar14 = local_9c;
                uVar12 = local_9c;
                do {
                  OVar10 = _local_108;
                  local_190 = (ulong)uVar12;
                  local_178.w = top_blob->w;
                  local_178.h = top_blob->h;
                  local_178.c = top_blob->d;
                  pvVar2 = top_blob->data;
                  local_178.elemsize = top_blob->elemsize;
                  sVar3 = top_blob->cstep;
                  puVar23 = (undefined8 *)(sVar3 * uVar15 * local_178.elemsize + (long)pvVar2);
                  local_178.elempack = top_blob->elempack;
                  local_178.allocator = top_blob->allocator;
                  local_178.refcount._0_4_ = 0;
                  local_178.refcount._4_4_ = 0;
                  local_178.d = 1;
                  local_178.dims = top_blob->dims + -1;
                  local_178.cstep =
                       (local_178.elemsize * (long)local_178.h * (long)local_178.w + 0xf &
                       0xfffffffffffffff0) / local_178.elemsize;
                  if (top_blob->dims == 4) {
                    local_178.cstep = (long)local_178.h * (long)local_178.w;
                  }
                  uVar16 = (ulong)(this->super_Padding).value;
                  local_130._0_4_ = (int)uVar15;
                  uVar24 = uVar14 + (int)local_130;
                  local_178.data = puVar23;
                  local_130 = uVar15;
                  if ((int)uVar24 < 0 || (int)uVar31 <= (int)uVar24) {
                    if (0 < local_178.c * (int)local_178.cstep) {
                      auVar36 = vpbroadcastq_avx512f();
                      auVar37 = vpbroadcastq_avx512f();
                      uVar16 = 0;
                      do {
                        auVar38 = vpbroadcastq_avx512f();
                        auVar38 = vporq_avx512f(auVar38,auVar35);
                        vpcmpuq_avx512f(auVar38,auVar36,2);
                        auVar38 = vmovdqu64_avx512f(auVar37);
                        *(undefined1 (*) [64])
                         ((long)pvVar2 + uVar16 * 8 + sVar3 * local_178.elemsize * uVar15) = auVar38
                        ;
                        uVar16 = uVar16 + 8;
                      } while ((local_178.c * (int)local_178.cstep + 7U & 0xfffffff8) != uVar16);
                    }
                  }
                  else {
                    iVar26 = bottom_blob->w;
                    local_118 = (long)iVar26;
                    local_128 = (ulong)bottom_blob->h;
                    local_88 = bottom_blob->data;
                    local_98 = bottom_blob->elemsize;
                    local_90 = bottom_blob->cstep;
                    puVar33 = (undefined8 *)(uVar24 * local_90 * local_98 + (long)local_88);
                    local_108._8_8_ = 0;
                    local_108._0_8_ = puVar33;
                    local_108._16_8_ = local_98;
                    auStack_ec = OVar10._28_36_;
                    iStack_f0 = bottom_blob->elempack;
                    pAStack_e8 = bottom_blob->allocator;
                    iStack_e0 = 3;
                    iStack_dc._0_1_ = (bool)(char)iVar26;
                    iStack_dc._1_1_ = (bool)(char)((uint)iVar26 >> 8);
                    iStack_dc._2_1_ = (bool)(char)((uint)iVar26 >> 0x10);
                    iStack_dc._3_1_ = (bool)(char)((uint)iVar26 >> 0x18);
                    iStack_d8 = bottom_blob->h;
                    uStack_d4._0_1_ = true;
                    uStack_d4._1_1_ = false;
                    uStack_d4._2_1_ = false;
                    uStack_d4._3_1_ = false;
                    auStack_ec._32_4_ = OVar10._60_4_;
                    uStack_d4._4_4_ = bottom_blob->d;
                    iStack_e0 = bottom_blob->dims + -1;
                    local_c8 = (local_98 * local_128 * local_118 + 0xf & 0xfffffffffffffff0) /
                               local_98;
                    if (bottom_blob->dims == 4) {
                      local_c8 = local_128 * local_118;
                    }
                    if ((this->super_Padding).type == 0) {
                      padding_constant_pack8_int8_sse
                                ((Mat *)local_108,&local_178,(this->super_Padding).top,
                                 (this->super_Padding).bottom,(this->super_Padding).left,
                                 (this->super_Padding).right,
                                 uVar16 << 0x38 | uVar16 << 0x30 | uVar16 << 0x28 |
                                 uVar16 << 0x20 | uVar16 << 0x18 | uVar16 << 0x10 | uVar16 << 8 |
                                 uVar16);
                      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    }
                    auVar11 = auStack_ec;
                    iVar26 = (this->super_Padding).type;
                    if (iVar26 == 2) {
                      iVar26 = (this->super_Padding).top;
                      iVar19 = (this->super_Padding).bottom;
                      local_78._0_4_ = iVar19;
                      uVar14 = (this->super_Padding).left;
                      lVar27 = (long)(int)uVar14;
                      uVar31 = (ulong)uVar14;
                      uVar24 = (this->super_Padding).right;
                      uVar15 = (ulong)uVar24;
                      lVar22 = (long)(iVar26 * (int)local_118);
                      local_a8 = CONCAT44(local_a8._4_4_,iVar26);
                      if (iVar26 < 1) {
                        puVar33 = puVar33 + lVar22;
                      }
                      else {
                        lVar30 = local_90 * local_98 * local_190;
                        lVar29 = lVar30 + lVar27 * 8 + lVar22 * 8 + (long)local_88;
                        puVar33 = (undefined8 *)(lVar30 + lVar22 * 8 + (long)local_88);
                        iVar32 = 0;
                        do {
                          if (0 < (int)uVar14) {
                            lVar22 = 0;
                            do {
                              *puVar23 = *(undefined8 *)(lVar29 + lVar22 * 8);
                              puVar23 = puVar23 + 1;
                              lVar22 = lVar22 + -1;
                            } while (-lVar22 != uVar31);
                          }
                          puVar18 = puVar33;
                          if (0 < (int)local_118) {
                            lVar22 = 0;
                            lVar30 = 0;
                            do {
                              puVar23[lVar30] = puVar33[lVar30];
                              lVar30 = lVar30 + 1;
                              lVar22 = lVar22 + -8;
                            } while ((int)local_118 != (int)lVar30);
                            puVar23 = (undefined8 *)((long)puVar23 - lVar22);
                            puVar18 = (undefined8 *)((long)puVar33 - lVar22);
                          }
                          if (0 < (int)uVar24) {
                            lVar22 = 0;
                            do {
                              *puVar23 = puVar18[lVar22 + -2];
                              puVar23 = puVar23 + 1;
                              lVar22 = lVar22 + -1;
                            } while (-lVar22 != uVar15);
                          }
                          puVar33 = puVar33 + -local_118;
                          iVar32 = iVar32 + 1;
                          lVar29 = lVar29 + local_118 * -8;
                        } while (iVar32 != iVar26);
                      }
                      if (0 < (int)local_128) {
                        iVar26 = 0;
                        do {
                          if (0 < (int)uVar14) {
                            lVar22 = 0;
                            do {
                              *puVar23 = puVar33[lVar27 + lVar22];
                              puVar23 = puVar23 + 1;
                              lVar22 = lVar22 + -1;
                            } while (-lVar22 != uVar31);
                          }
                          if (0 < (int)local_118) {
                            lVar22 = 0;
                            lVar29 = 0;
                            do {
                              puVar23[lVar29] = puVar33[lVar29];
                              lVar29 = lVar29 + 1;
                              lVar22 = lVar22 + -8;
                            } while ((int)local_118 != (int)lVar29);
                            puVar23 = (undefined8 *)((long)puVar23 - lVar22);
                            puVar33 = (undefined8 *)((long)puVar33 - lVar22);
                          }
                          if (0 < (int)uVar24) {
                            lVar22 = 0;
                            do {
                              *puVar23 = puVar33[lVar22 + -2];
                              puVar23 = puVar23 + 1;
                              lVar22 = lVar22 + -1;
                            } while (-lVar22 != uVar15);
                          }
                          iVar26 = iVar26 + 1;
                        } while (iVar26 != (int)local_128);
                      }
                      if (0 < iVar19) {
                        puVar18 = puVar33 + -(long)((int)local_118 * 2);
                        puVar33 = puVar33 + (lVar27 - (int)local_118 * 2);
                        iVar26 = 0;
                        do {
                          if (0 < (int)uVar14) {
                            lVar27 = 0;
                            do {
                              *puVar23 = puVar33[lVar27];
                              puVar23 = puVar23 + 1;
                              lVar27 = lVar27 + -1;
                            } while (-lVar27 != uVar31);
                          }
                          puVar25 = puVar18;
                          if (0 < (int)local_118) {
                            lVar22 = 0;
                            lVar27 = 0;
                            do {
                              puVar23[lVar27] = puVar18[lVar27];
                              lVar27 = lVar27 + 1;
                              lVar22 = lVar22 + -8;
                            } while ((int)local_118 != (int)lVar27);
                            puVar23 = (undefined8 *)((long)puVar23 - lVar22);
                            puVar25 = (undefined8 *)((long)puVar18 - lVar22);
                          }
                          if (0 < (int)uVar24) {
                            lVar27 = 0;
                            do {
                              *puVar23 = puVar25[lVar27 + -2];
                              puVar23 = puVar23 + 1;
                              lVar27 = lVar27 + -1;
                            } while (-lVar27 != uVar15);
                          }
                          puVar18 = puVar18 + -local_118;
                          iVar26 = iVar26 + 1;
                          puVar33 = puVar33 + -local_118;
                        } while (iVar26 != iVar19);
                      }
                    }
                    else if (iVar26 == 1) {
                      iVar26 = (this->super_Padding).top;
                      iVar19 = (this->super_Padding).bottom;
                      iVar32 = (this->super_Padding).left;
                      iVar17 = (this->super_Padding).right;
                      if (0 < iVar26) {
                        lVar27 = local_90 * local_98 * local_190;
                        iVar28 = 0;
                        do {
                          iVar20 = iVar32;
                          if (0 < iVar32) {
                            do {
                              *puVar23 = *puVar33;
                              puVar23 = puVar23 + 1;
                              iVar20 = iVar20 + -1;
                            } while (iVar20 != 0);
                          }
                          puVar18 = puVar33;
                          if (0 < (int)local_118) {
                            lVar29 = 0;
                            lVar22 = 0;
                            do {
                              puVar23[lVar22] =
                                   *(undefined8 *)((long)local_88 + lVar22 * 8 + lVar27);
                              lVar22 = lVar22 + 1;
                              lVar29 = lVar29 + -8;
                            } while ((int)local_118 != (int)lVar22);
                            puVar23 = (undefined8 *)((long)puVar23 - lVar29);
                            puVar18 = (undefined8 *)((long)local_88 + (lVar27 - lVar29));
                          }
                          iVar20 = iVar17;
                          if (0 < iVar17) {
                            do {
                              *puVar23 = puVar18[-1];
                              puVar23 = puVar23 + 1;
                              iVar20 = iVar20 + -1;
                            } while (iVar20 != 0);
                          }
                          iVar28 = iVar28 + 1;
                        } while (iVar28 != iVar26);
                      }
                      if (0 < (int)local_128) {
                        iVar26 = 0;
                        do {
                          iVar28 = iVar32;
                          if (0 < iVar32) {
                            do {
                              *puVar23 = *puVar33;
                              puVar23 = puVar23 + 1;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                          }
                          if (0 < (int)local_118) {
                            lVar22 = 0;
                            lVar27 = 0;
                            do {
                              puVar23[lVar27] = puVar33[lVar27];
                              lVar27 = lVar27 + 1;
                              lVar22 = lVar22 + -8;
                            } while ((int)local_118 != (int)lVar27);
                            puVar23 = (undefined8 *)((long)puVar23 - lVar22);
                            puVar33 = (undefined8 *)((long)puVar33 - lVar22);
                          }
                          iVar28 = iVar17;
                          if (0 < iVar17) {
                            do {
                              *puVar23 = puVar33[-1];
                              puVar23 = puVar23 + 1;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                          }
                          iVar26 = iVar26 + 1;
                        } while (iVar26 != (int)local_128);
                      }
                      if (0 < iVar19) {
                        puVar33 = puVar33 + -local_118;
                        iVar26 = 0;
                        do {
                          iVar28 = iVar32;
                          if (0 < iVar32) {
                            do {
                              *puVar23 = *puVar33;
                              puVar23 = puVar23 + 1;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                          }
                          puVar18 = puVar33;
                          if (0 < (int)local_118) {
                            lVar22 = 0;
                            lVar27 = 0;
                            do {
                              puVar23[lVar27] = puVar33[lVar27];
                              lVar27 = lVar27 + 1;
                              lVar22 = lVar22 + -8;
                            } while ((int)local_118 != (int)lVar27);
                            puVar23 = (undefined8 *)((long)puVar23 - lVar22);
                            puVar18 = (undefined8 *)((long)puVar33 - lVar22);
                          }
                          iVar28 = iVar17;
                          if (0 < iVar17) {
                            do {
                              *puVar23 = puVar18[-1];
                              puVar23 = puVar23 + 1;
                              iVar28 = iVar28 + -1;
                            } while (iVar28 != 0);
                          }
                          iVar26 = iVar26 + 1;
                        } while (iVar26 != iVar19);
                      }
                    }
                    local_c8 = 0;
                    local_108._0_12_ = SUB1612((undefined1  [16])0x0,0);
                    _local_108 = ZEXT1228(local_108._0_12_);
                    auStack_ec._32_4_ = auVar11._32_4_;
                    _local_108 = ZEXT4060(_local_108);
                    opt = local_c0;
                    uVar31 = local_b8;
                    uVar14 = local_9c;
                  }
                  piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (local_178.allocator == (Allocator *)0x0) {
                        if ((undefined8 *)local_178.data != (undefined8 *)0x0) {
                          free(local_178.data);
                          auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        }
                      }
                      else {
                        (*(local_178.allocator)->_vptr_Allocator[3])();
                        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      }
                    }
                  }
                  local_178.cstep = 0;
                  local_178.data = (void *)0x0;
                  local_178.refcount._0_4_ = 0;
                  local_178.refcount._4_4_ = 0;
                  local_178.elemsize = 0;
                  local_178.elempack = 0;
                  local_178.dims = 0;
                  local_178.w = 0;
                  local_178.h = 0;
                  local_178.d = 0;
                  local_178.c = 0;
                  uVar15 = local_130 + 1;
                  uVar12 = uVar12 + 1;
                } while (uVar15 != local_80);
                unaff_EBP = 0;
                goto LAB_0043b97c;
              }
              unaff_EBP = 0;
            }
          }
        }
      }
      if (!bVar5) {
        return unaff_EBP;
      }
    }
    if (iVar21 == 4) {
      iVar21 = (this->super_Padding).type;
      if (iVar21 == 0) {
        uVar12 = (this->super_Padding).front + local_11c + (this->super_Padding).behind;
        Mat::create(top_blob,iVar1 + (this->super_Padding).left + (this->super_Padding).right,
                    (int)local_b0 + (this->super_Padding).top + (this->super_Padding).bottom,uVar12,
                    (int)uVar31,local_110,8,opt->blob_allocator);
        unaff_EBP = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if ((int)uVar31 < 1) {
            unaff_EBP = 0;
          }
          else {
            local_128 = local_128 & 0xffffffff00000000;
            uVar15 = 0;
            auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            local_c0 = opt;
            local_b8 = uVar31;
            do {
              if (0 < (int)uVar12) {
                local_a8 = (ulong)(this->super_Padding).value;
                local_a8 = local_a8 << 0x38 | local_a8 << 0x30 | local_a8 << 0x28 |
                           local_a8 << 0x20 | local_a8 << 0x18 | local_a8 << 0x10 | local_a8 << 8 |
                           local_a8;
                auVar36 = vpbroadcastq_avx512f();
                uVar31 = 0;
                local_78 = vmovdqu64_avx512f(auVar36);
                do {
                  OVar10 = _local_108;
                  local_178.w = top_blob->w;
                  local_178.h = top_blob->h;
                  local_178.elemsize = top_blob->elemsize;
                  local_178.elempack = top_blob->elempack;
                  local_178.allocator = top_blob->allocator;
                  local_178.cstep = (long)local_178.h * (long)local_178.w;
                  local_178.data =
                       (void *)((long)top_blob->data +
                               uVar31 * local_178.elemsize * local_178.cstep +
                               top_blob->cstep * uVar15 * local_178.elemsize);
                  local_178.refcount._0_4_ = 0;
                  local_178.refcount._4_4_ = 0;
                  local_178.dims = 2;
                  local_178.d = 1;
                  local_178.c = 1;
                  uVar14 = (int)uVar31 - (this->super_Padding).front;
                  if ((int)uVar14 < 0 || local_11c <= (int)uVar14) {
                    if (0 < (int)local_178.cstep) {
                      auVar37 = vpbroadcastq_avx512f();
                      uVar16 = 0;
                      do {
                        auVar38 = vpbroadcastq_avx512f();
                        auVar38 = vporq_avx512f(auVar38,auVar35);
                        vpcmpuq_avx512f(auVar38,auVar37,2);
                        auVar38 = vmovdqu64_avx512f(auVar36);
                        *(undefined1 (*) [64])((long)local_178.data + uVar16 * 8) = auVar38;
                        uVar16 = uVar16 + 8;
                      } while (((int)local_178.cstep + 7U & 0xfffffff8) != uVar16);
                    }
                  }
                  else {
                    iVar1 = bottom_blob->w;
                    local_108._16_8_ = bottom_blob->elemsize;
                    local_c8 = (long)bottom_blob->h * (long)iVar1;
                    local_108._8_8_ = 0;
                    local_108._0_8_ =
                         (long)bottom_blob->data +
                         (ulong)uVar14 * local_108._16_8_ * local_c8 +
                         bottom_blob->cstep * uVar15 * local_108._16_8_;
                    auStack_ec = OVar10._28_36_;
                    iStack_f0 = bottom_blob->elempack;
                    pAStack_e8 = bottom_blob->allocator;
                    iStack_e0 = 2;
                    iStack_dc._0_1_ = (bool)(char)iVar1;
                    iStack_dc._1_1_ = (bool)(char)((uint)iVar1 >> 8);
                    iStack_dc._2_1_ = (bool)(char)((uint)iVar1 >> 0x10);
                    iStack_dc._3_1_ = (bool)(char)((uint)iVar1 >> 0x18);
                    iStack_d8 = bottom_blob->h;
                    auStack_ec._32_4_ = OVar10._60_4_;
                    uStack_d4._0_1_ = true;
                    uStack_d4._1_1_ = false;
                    uStack_d4._2_1_ = false;
                    uStack_d4._3_1_ = false;
                    uStack_d4._4_1_ = true;
                    uStack_d4._5_1_ = false;
                    uStack_d4._6_1_ = false;
                    uStack_d4._7_1_ = false;
                    padding_constant_pack8_int8_sse
                              ((Mat *)local_108,&local_178,(this->super_Padding).top,
                               (this->super_Padding).bottom,(this->super_Padding).left,
                               (this->super_Padding).right,local_a8);
                    auVar36 = vmovdqu64_avx512f(local_78);
                    auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    if ((Allocator *)local_108._8_8_ != (Allocator *)0x0) {
                      LOCK();
                      *(int *)(_func_int ***)local_108._8_8_ =
                           *(int *)(_func_int ***)local_108._8_8_ + -1;
                      UNLOCK();
                      if (*(int *)(_func_int ***)local_108._8_8_ == 0) {
                        if (pAStack_e8 == (Allocator *)0x0) {
                          if ((void *)local_108._0_8_ != (void *)0x0) {
                            free((void *)local_108._0_8_);
                            auVar36 = vmovdqu64_avx512f(local_78);
                            auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                          }
                        }
                        else {
                          (*pAStack_e8->_vptr_Allocator[3])();
                          auVar36 = vmovdqu64_avx512f(local_78);
                          auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        }
                      }
                    }
                    auVar11 = auStack_ec;
                    local_c8 = 0;
                    local_108._0_12_ = SUB1612((undefined1  [16])0x0,0);
                    _local_108 = ZEXT1228(local_108._0_12_);
                    auStack_ec._32_4_ = auVar11._32_4_;
                    _local_108 = ZEXT4060(_local_108);
                  }
                  piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (local_178.allocator == (Allocator *)0x0) {
                        if (local_178.data != (void *)0x0) {
                          free(local_178.data);
                          auVar36 = vmovdqu64_avx512f(local_78);
                          auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        }
                      }
                      else {
                        (*(local_178.allocator)->_vptr_Allocator[3])();
                        auVar36 = vmovdqu64_avx512f(local_78);
                        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      }
                    }
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar31 != uVar12);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != local_b8);
            unaff_EBP = 0;
            opt = local_c0;
            iVar21 = (int)local_128;
          }
        }
      }
      if (iVar21 == 0) {
        return unaff_EBP;
      }
    }
  }
  piVar4 = bottom_blob->refcount;
  local_178.data = bottom_blob->data;
  local_178.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_178.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_178.elemsize = bottom_blob->elemsize;
  local_178.elempack = bottom_blob->elempack;
  local_178.allocator = bottom_blob->allocator;
  uVar6 = bottom_blob->dims;
  uVar7 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  uVar9 = bottom_blob->d;
  local_178.c = bottom_blob->c;
  local_178.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  local_178.dims = uVar6;
  local_178.w = uVar7;
  local_178.h = uVar8;
  local_178.d = uVar9;
  if (iVar13 != 1) {
    auVar35 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar35 = vmovdqu64_avx512f(auVar35);
    stack0xffffffffffffff08 = auVar35._16_48_;
    local_108._0_8_ = auVar35._0_8_;
    local_108._8_8_ = opt->workspace_allocator;
    convert_packing(bottom_blob,&local_178,1,(Option *)local_108);
    if (local_178.data == (void *)0x0 || (long)local_178.c * local_178.cstep == 0) {
      iVar13 = -100;
      goto LAB_0043ba86;
    }
  }
  iVar13 = Padding::forward(&this->super_Padding,&local_178,top_blob,opt);
LAB_0043ba86:
  piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar13;
}

Assistant:

int Padding_x86_avx512::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}